

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O3

void __thiscall chrono::ChShaft::ArchiveOUT(ChShaft *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaft>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_30 = &this->torque;
  local_38 = "torque";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->pos;
  local_38 = "pos";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->pos_dt;
  local_38 = "pos_dt";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->pos_dtdt;
  local_38 = "pos_dtdt";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->inertia;
  local_38 = "inertia";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->fixed;
  local_38 = "fixed";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = (double *)&this->limitspeed;
  local_38 = "limitspeed";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = (double *)&this->max_speed;
  local_38 = "max_speed";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (double *)&this->sleep_time;
  local_38 = "sleep_time";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (double *)&this->sleep_starttime;
  local_38 = "sleep_starttime";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (double *)&this->sleep_minspeed;
  local_38 = "sleep_minspeed";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (double *)&this->sleep_minwvel;
  local_38 = "sleep_minwvel";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (double *)&this->sleeping;
  local_38 = "sleeping";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = (double *)&this->use_sleeping;
  local_38 = "use_sleeping";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChShaft::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaft>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(torque);
    marchive << CHNVP(pos);
    marchive << CHNVP(pos_dt);
    marchive << CHNVP(pos_dtdt);
    marchive << CHNVP(inertia);
    marchive << CHNVP(fixed);
    marchive << CHNVP(limitspeed);
    marchive << CHNVP(max_speed);
    marchive << CHNVP(sleep_time);
    marchive << CHNVP(sleep_starttime);
    marchive << CHNVP(sleep_minspeed);
    marchive << CHNVP(sleep_minwvel);
    marchive << CHNVP(sleeping);
    marchive << CHNVP(use_sleeping);
}